

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O3

bool QFontDatabase::hasFamily(QString *family)

{
  QtFontFamily *pQVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  Type *pTVar5;
  QtFontFamily **ppQVar6;
  bool bVar7;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_> *this;
  long lVar8;
  long in_FS_OFFSET;
  QDeadlineTimer QVar9;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined1 *local_78;
  QString local_68;
  QString local_48;
  long local_28;
  
  this = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_> *)
         &local_88;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d.d = (Data *)0x0;
  local_48.d.ptr = (char16_t *)0x0;
  local_48.d.size = 0;
  local_68.d.d = (Data *)0x0;
  local_68.d.ptr = (char16_t *)0x0;
  local_68.d.size = 0;
  parseFontName(family,&local_68,&local_48);
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  local_88 = 0xaaaaaaaa;
  uStack_84 = 0xaaaaaaaa;
  uStack_80 = 0xaaaaaaaa;
  uStack_7c = 0xaaaaaaaa;
  iVar3 = (*QGuiApplicationPrivate::platform_integration->_vptr_QPlatformIntegration[0xd])();
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x78))
            (&local_88,(long *)CONCAT44(extraout_var,iVar3),&local_48);
  pTVar5 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>::
           operator()(this);
  if (pTVar5 != (Type *)0x0) {
    QVar9.t2 = 0xffffffff;
    QVar9.type = 0x7fffffff;
    QVar9.t1 = (qint64)pTVar5;
    QRecursiveMutex::tryLock(QVar9);
  }
  QFontDatabasePrivate::ensureFontDatabase();
  if (0 < QFontDatabasePrivate::instance::instance.count) {
    lVar8 = 0;
    ppQVar6 = QFontDatabasePrivate::instance::instance.families;
    iVar3 = QFontDatabasePrivate::instance::instance.count;
    do {
      pQVar1 = ppQVar6[lVar8];
      if ((((undefined1  [112])((undefined1  [112])*pQVar1 & (undefined1  [112])0x1) ==
            (undefined1  [112])0x0) || (pQVar1->count != 0)) &&
         (iVar4 = QString::compare((QString *)&local_88,(int)pQVar1 + 8),
         ppQVar6 = QFontDatabasePrivate::instance::instance.families,
         iVar3 = QFontDatabasePrivate::instance::instance.count, iVar4 == 0)) {
        bVar7 = true;
        goto LAB_0025c513;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < iVar3);
  }
  bVar7 = false;
LAB_0025c513:
  if (pTVar5 != (Type *)0x0) {
    QRecursiveMutex::unlock();
  }
  piVar2 = (int *)CONCAT44(uStack_84,local_88);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(uStack_84,local_88),2,0x10);
    }
  }
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return bVar7;
}

Assistant:

bool QFontDatabase::hasFamily(const QString &family)
{
    QString parsedFamily, foundry;
    parseFontName(family, foundry, parsedFamily);
    const QString familyAlias = QFontDatabasePrivate::resolveFontFamilyAlias(parsedFamily);

    QMutexLocker locker(fontDatabaseMutex());
    QFontDatabasePrivate *d = QFontDatabasePrivate::ensureFontDatabase();

    for (int i = 0; i < d->count; i++) {
        QtFontFamily *f = d->families[i];
        if (f->populated && f->count == 0)
            continue;
        if (familyAlias.compare(f->name, Qt::CaseInsensitive) == 0)
            return true;
    }

    return false;
}